

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

void __thiscall catalog::showTable(catalog *this)

{
  reference ppTVar1;
  ostream *this_00;
  int local_14;
  int i;
  catalog *this_local;
  
  for (local_14 = 0; local_14 < this->tableNumber; local_14 = local_14 + 1) {
    ppTVar1 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_14);
    this_00 = std::operator<<((ostream *)&std::cout,(string *)*ppTVar1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void catalog::showTable(){
    for(int i = 0 ; i < tableNumber ; i ++){
        std::cout<<TableInfoList[i]->tableName<<std::endl;
    }
}